

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O3

string * __thiscall
cmCoreTryCompile::LookupStdVar
          (string *__return_storage_ptr__,cmCoreTryCompile *this,string *var,bool warnCMP0067)

{
  char *pcVar1;
  undefined3 in_register_00000009;
  allocator local_21;
  
  pcVar1 = cmMakefile::GetSafeDefinition((this->super_cmCommand).Makefile,var);
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_21);
  if ((CONCAT31(in_register_00000009,warnCMP0067) != 0) &&
     (__return_storage_ptr__->_M_string_length != 0)) {
    __return_storage_ptr__->_M_string_length = 0;
    *(__return_storage_ptr__->_M_dataplus)._M_p = '\0';
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->WarnCMP0067,var);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCoreTryCompile::LookupStdVar(std::string const& var,
                                           bool warnCMP0067)
{
  std::string value = this->Makefile->GetSafeDefinition(var);
  if (warnCMP0067 && !value.empty()) {
    value.clear();
    this->WarnCMP0067.push_back(var);
  }
  return value;
}